

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImGuiContext *pIVar1;
  ImGuiID IVar2;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != window) {
    __assert_fail("window == g.NavWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xad5,"void ImGui::NavInitWindow(ImGuiWindow *, bool)");
  }
  if (((uint)window->Flags >> 0x12 & 1) == 0) {
    if (((window->Flags & 0x5000000U) != 0x1000000) ||
       (IVar2 = window->NavLastIds[0], IVar2 == 0 || force_reinit)) {
      SetNavID(0,GImGui->NavLayer);
      pIVar1->NavInitRequest = true;
      pIVar1->NavInitRequestFromMove = false;
      pIVar1->NavInitResultId = 0;
      (pIVar1->NavInitResultRectRel).Min.x = 3.4028235e+38;
      (pIVar1->NavInitResultRectRel).Min.y = 3.4028235e+38;
      (pIVar1->NavInitResultRectRel).Max.x = -3.4028235e+38;
      (pIVar1->NavInitResultRectRel).Max.y = -3.4028235e+38;
      NavUpdateAnyRequestFlag();
      return;
    }
  }
  else {
    IVar2 = window->NavLastIds[0];
  }
  GImGui->NavId = IVar2;
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);
    bool init_for_nav = false;
    if (!(window->Flags & ImGuiWindowFlags_NoNavInputs))
        if (!(window->Flags & ImGuiWindowFlags_ChildWindow) || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
            init_for_nav = true;
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer);
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
    }
}